

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void ParseEntity(TidyDocImpl *doc,GetTokenMode mode)

{
  uint *puVar1;
  Lexer *lexer;
  uint c;
  int iVar2;
  Bool BVar3;
  uint uVar4;
  uint uVar5;
  undefined8 extraout_RAX;
  void *pvVar6;
  TidyDocImpl *pTVar7;
  GetTokenMode GVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  char cVar13;
  ulong uVar14;
  uint ch;
  GetTokenMode local_8c;
  TidyDocImpl *local_88;
  tchar local_7c;
  void *local_78;
  undefined4 local_70;
  uint local_6c;
  uint entver;
  int local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  Lexer *local_50;
  ulong local_48;
  Bool local_3c;
  ulong local_38;
  
  local_48 = (ulong)*(uint *)((doc->config).value + 0x40);
  local_78 = (void *)CONCAT44(local_78._4_4_,*(undefined4 *)((doc->config).value + 0x67));
  entver = 0;
  lexer = doc->lexer;
  local_38 = (ulong)lexer->lexsize;
  local_6c = lexer->lexsize - 1;
  local_5c = doc->docIn->curcol - 1;
  uVar4 = 0;
  local_8c = mode;
  local_88 = doc;
LAB_00148aae:
  uVar11 = uVar4;
  do {
    c = prvTidyReadChar(local_88->docIn);
    pTVar7 = local_88;
    if (c == 0xffffffff) {
      local_70 = 0xffffff01;
LAB_00148b9b:
      lexer->lexbuf[lexer->lexsize] = '\0';
      uVar12 = (ulong)local_6c;
      iVar2 = prvTidytmbstrcmp(lexer->lexbuf + uVar12,"&apos");
      GVar8 = local_8c;
      if ((((iVar2 == 0) && (*(int *)((pTVar7->config).value + 100) == 0)) &&
          (lexer->isvoyager == no)) &&
         ((*(int *)((pTVar7->config).value + 0x62) == 0 &&
          (iVar2 = prvTidyHTMLVersion(pTVar7), iVar2 != 0x20000)))) {
        prvTidyReportEntityError(pTVar7,0x225,lexer->lexbuf + uVar12,0x27);
      }
      if (c == 0x3b && GVar8 == OtherNamespace) {
        ch = 0xff;
        entver = 0x60000;
        cVar13 = '\0';
        goto LAB_00148ff2;
      }
      BVar3 = prvTidyEntityInfo(lexer->lexbuf + uVar12,(Bool)local_78,&ch,&entver);
      uVar14 = CONCAT71((int7)((ulong)lexer >> 8),local_48 == 0);
      if ((local_48 != 0) || (BVar3 == no)) goto LAB_00148f58;
      local_48 = uVar14 & 0xffffffff;
      local_3c = BVar3;
      BVar3 = prvTidyIsLowSurrogate(ch);
      if (BVar3 == no) {
        BVar3 = prvTidyIsHighSurrogate(ch);
        cVar13 = (char)local_48;
        if (BVar3 == no) goto LAB_00148ff2;
        uVar5 = 0x22e;
      }
      else {
        uVar5 = prvTidyReadChar(pTVar7->docIn);
        if (uVar5 == 0x26) {
          local_60 = ch;
          local_50 = pTVar7->lexer;
          if ((local_50 == (Lexer *)0x0) ||
             (pvVar6 = (*local_50->allocator->vtbl->realloc)(local_50->allocator,(void *)0x0,0x20),
             pvVar6 == (void *)0x0)) goto LAB_00148fc8;
          uVar14 = 0x20;
          uVar4 = 0;
          iVar2 = 0;
          local_58 = uVar12;
          goto LAB_00148ce7;
        }
        prvTidyUngetChar(uVar5,pTVar7->docIn);
        uVar5 = 0x230;
      }
      prvTidyReportSurrogateError(pTVar7,uVar5,ch,0);
      ch = 0xfffd;
      goto LAB_00148fef;
    }
    if (c == 0x3b) {
      local_70 = 0;
      goto LAB_00148b9b;
    }
    if (c == 0x23 && uVar11 == 0) {
      if (*(int *)((local_88->config).value + 0x38) != 0) {
        c = 0x23;
        uVar4 = 1;
        if (((local_88->config).value[0x22].v & 0xfffffffffffffffe) != 0xc) goto LAB_00148b5a;
      }
      prvTidyUngetChar(0x23,local_88->docIn);
      return;
    }
    if (uVar11 == 1 && uVar4 == 1) {
      if ((c == 0x78) || (c == 0x58 && (Bool)local_78 == 0)) break;
    }
    iVar2 = (*(code *)(&PTR_prvTidyIsNamechar_001cd6a0)[uVar4])(c);
    pTVar7 = local_88;
    if (iVar2 == 0) {
      prvTidyUngetChar(c,local_88->docIn);
      local_70 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      goto LAB_00148b9b;
    }
    prvTidyAddCharToLexer(lexer,c);
    uVar11 = uVar11 + 1;
  } while( true );
  uVar4 = 2;
LAB_00148b5a:
  prvTidyAddCharToLexer(lexer,c);
  goto LAB_00148aae;
  while (uVar4 = 1, iVar2 = local_64, uVar5 == 0x23) {
LAB_00148ce7:
    local_64 = iVar2;
    uVar11 = uVar4;
    uVar12 = (ulong)uVar11;
    uVar5 = prvTidyReadChar(local_88->docIn);
    if ((uVar5 == 0xffffffff) || (uVar5 == 0x3b)) goto LAB_00148e81;
    if ((uint)uVar14 < uVar11 + 2) {
      uVar14 = (ulong)((uint)uVar14 * 2);
      pvVar6 = (*local_50->allocator->vtbl->realloc)(local_50->allocator,pvVar6,uVar14);
      if (pvVar6 == (void *)0x0) {
        pvVar6 = (void *)0x0;
        goto LAB_00148e81;
      }
    }
    *(char *)((long)pvVar6 + uVar12) = (char)uVar5;
    if (uVar11 != 0) {
      uVar4 = uVar11 + 1;
      if (uVar11 == 1) {
        iVar2 = 1;
        if ((uVar5 == 0x78) || (iVar2 = 1, uVar5 == 0x58 && (Bool)local_78 == 0)) goto LAB_00148ce7;
      }
      GVar8 = local_8c;
      if (local_64 == 0) {
        if (uVar5 < 0x80) {
          iVar2 = 0;
          if ((lexmap[uVar5] & 1) == 0) {
            uVar11 = uVar11 + 1;
            if (uVar5 != 0x3b) goto LAB_00148f6c;
            *(undefined1 *)((long)pvVar6 + (ulong)uVar11) = 0;
            goto LAB_00148eae;
          }
          goto LAB_00148ce7;
        }
      }
      else if (uVar5 < 0x80) {
        iVar2 = 1;
        if ((lexmap[uVar5] & 0x80) == 0) {
          uVar12 = (ulong)(uVar11 + 1);
          goto LAB_00148e81;
        }
        goto LAB_00148ce7;
      }
      uVar11 = uVar11 + 1;
      goto LAB_00148f6c;
    }
  }
  uVar12 = 1;
LAB_00148e81:
  uVar11 = (uint)uVar12;
  GVar8 = local_8c;
  if (uVar5 == 0x3b) {
    *(undefined1 *)((long)pvVar6 + uVar12) = 0;
    if (local_64 == 0) {
LAB_00148eae:
      lVar10 = (long)pvVar6 + 1;
      pcVar9 = "%d";
      local_78 = pvVar6;
    }
    else {
      lVar10 = (long)pvVar6 + 2;
      pcVar9 = "%x";
      local_78 = pvVar6;
    }
    pTVar7 = local_88;
    GVar8 = local_8c;
    __isoc99_sscanf(lVar10,pcVar9,&local_7c);
    BVar3 = prvTidyIsHighSurrogate(local_7c);
    uVar5 = local_60;
    if (BVar3 == no) {
      prvTidyUngetChar(0x3b,pTVar7->docIn);
      pvVar6 = local_78;
      goto LAB_00148f6c;
    }
    local_7c = prvTidyCombineSurrogatePair(local_7c,local_60);
    BVar3 = prvTidyIsValidCombinedChar(local_7c);
    if (BVar3 == no) {
      ch = 0xfffd;
      prvTidyReportSurrogateError(pTVar7,0x22f,uVar5,local_7c);
    }
    else {
      ch = local_7c;
    }
    uVar12 = local_58;
    (*local_50->allocator->vtbl->free)(local_50->allocator,local_78);
    uVar14 = local_48 & 0xffffffff;
    BVar3 = local_3c;
LAB_00148f58:
    cVar13 = (char)uVar14;
    if (BVar3 == no) goto LAB_0014901a;
  }
  else {
LAB_00148f6c:
    uVar12 = local_58;
    if ((pvVar6 == (void *)0x0) || (uVar11 == 0)) {
      if (pvVar6 != (void *)0x0) goto LAB_00148fb6;
    }
    else {
      while (uVar11 = uVar11 - 1, -1 < (int)uVar11) {
        prvTidyUngetChar((int)*(char *)((long)pvVar6 + (ulong)(uVar11 & 0x7fffffff)),local_88->docIn
                        );
      }
LAB_00148fb6:
      (*local_50->allocator->vtbl->free)(local_50->allocator,pvVar6);
    }
LAB_00148fc8:
    pTVar7 = local_88;
    prvTidyReportSurrogateError(local_88,0x230,local_60,0);
    prvTidyUngetChar(0x26,pTVar7->docIn);
LAB_00148fef:
    cVar13 = '\x01';
  }
LAB_00148ff2:
  if (((ch & 0xffffffe0) != 0x80) && (c == 0x3b || ch < 0x100)) {
    if (c != 0x3b) {
      lexer->lines = pTVar7->docIn->curline;
      lexer->columns = local_5c;
      prvTidyReportEntityError(pTVar7,0x260,lexer->lexbuf + uVar12,c);
      GVar8 = local_8c;
    }
    if (cVar13 == '\0') {
      prvTidyAddCharToLexer(lexer,0x3b);
    }
    else {
      lexer->lexsize = local_6c;
      if (GVar8 == Preformatted && ch == 0xa0) {
        ch = 0x20;
      }
      prvTidyAddCharToLexer(lexer,ch);
      if ((ch == 0x26) && (*(int *)((pTVar7->config).value + 0x45) == 0)) {
        AddStringToLexer(lexer,anon_var_dwarf_50e43 + 0x2b);
      }
    }
    puVar1 = &pTVar7->lexer->versions;
    *puVar1 = *puVar1 & (entver | 0xe000);
    return;
  }
LAB_0014901a:
  lexer->lines = pTVar7->docIn->curline;
  lexer->columns = local_5c;
  if ((uint)local_38 < lexer->lexsize) {
    if ((ch & 0xffffffe0) == 0x80) {
      uVar5 = prvTidyDecodeWin1252(ch);
      if (c != 0x3b) {
        prvTidyReportEntityError(pTVar7,0x25f,lexer->lexbuf + uVar12,c);
      }
      prvTidyReportEncodingError(pTVar7,0x249,ch,(uint)(uVar5 == 0));
      lexer->lexsize = local_6c;
      if (uVar5 == 0) {
        return;
      }
    }
    else {
      prvTidyReportEntityError(pTVar7,0x28d,lexer->lexbuf + uVar12,ch);
      if ((char)local_70 != '\0') {
        return;
      }
      uVar5 = 0x3b;
    }
    prvTidyAddCharToLexer(lexer,uVar5);
  }
  else {
    iVar2 = prvTidyHTMLVersion(pTVar7);
    if (iVar2 != 0x20000) {
      prvTidyReportEntityError(pTVar7,0x282,lexer->lexbuf + uVar12,ch);
    }
  }
  return;
}

Assistant:

static void ParseEntity( TidyDocImpl* doc, GetTokenMode mode )
{
    typedef enum
    {
        ENT_default,
        ENT_numdec,
        ENT_numhex
    } ENTState;
    
    typedef Bool (*ENTfn)(uint);
    const ENTfn entFn[] = {
        TY_(IsNamechar),
        TY_(IsDigit),
        IsDigitHex
    };
    uint start;
    ENTState entState = ENT_default;
    uint charRead = 0;
    Bool semicolon = no, found = no;
    Bool isXml = cfgBool( doc, TidyXmlTags );
    Bool preserveEntities = cfgBool( doc, TidyPreserveEntities );
    uint c, ch, startcol, entver = 0;
    Lexer* lexer = doc->lexer;

    start = lexer->lexsize - 1;  /* to start at "&" */
    startcol = doc->docIn->curcol - 1;

    while ( (c = TY_(ReadChar)(doc->docIn)) != EndOfStream )
    {
        if ( c == ';' )
        {
            semicolon = yes;
            break;
        }
        ++charRead;

        if (charRead == 1 && c == '#')
        {
            if ( !cfgBool(doc, TidyNCR) ||
                 cfg(doc, TidyInCharEncoding) == BIG5 ||
                 cfg(doc, TidyInCharEncoding) == SHIFTJIS )
            {
                TY_(UngetChar)('#', doc->docIn);
                return;
            }

            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numdec;
            continue;
        }
        else if (charRead == 2 && entState == ENT_numdec
                 && (c == 'x' || (!isXml && c == 'X')) )
        {
            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numhex;
            continue;
        }

        if ( entFn[entState](c) )
        {
            TY_(AddCharToLexer)( lexer, c );
            continue;
        }

        /* otherwise put it back */
        TY_(UngetChar)( c, doc->docIn );
        break;
    }

    /* make sure entity is NULL terminated */
    lexer->lexbuf[lexer->lexsize] = '\0';

    /* Should contrain version to XML/XHTML if &apos; 
    ** is encountered.  But this is not possible with
    ** Tidy's content model bit mask.
    */
    if ( TY_(tmbstrcmp)(lexer->lexbuf+start, "&apos") == 0
         && !cfgBool(doc, TidyXmlOut)
         && !lexer->isvoyager
         && !cfgBool(doc, TidyXhtmlOut)
         && !(TY_(HTMLVersion)(doc) == HT50) ) /* Issue #239 - no warning if in HTML5++ mode */
        TY_(ReportEntityError)( doc, APOS_UNDEFINED, lexer->lexbuf+start, 39 );

    if (( mode == OtherNamespace ) && ( c == ';' ))
    {
        /* #130 MathML attr and entity fix! */
        found = yes;
        ch = 255;
        entver = XH50|HT50;
        preserveEntities = yes;
    }
    else
    {
        /* Lookup entity code and version
        */
        found = TY_(EntityInfo)( lexer->lexbuf+start, isXml, &ch, &entver );
    }

    /* Issue #483 - Deal with 'surrogate pairs' */
    /* TODO: Maybe warning/error, like found a leading surrogate
       but no following surrogate! Maybe should avoid outputting
       invalid utf-8 for this entity - maybe substitute?  */
    if (!preserveEntities && found && TY_(IsLowSurrogate)(ch))
    {
        uint c1;
        if ((c1 = TY_(ReadChar)(doc->docIn)) == '&')
        {
            SPStatus status;
            /* Have a following entity, 
               so there is a chance of having a valid surrogate pair */
            c1 = ch;    /* keep first value, in case of error */
            status = GetSurrogatePair(doc, isXml, &ch);
            if (status == SP_error)
            {
                TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, c1, 0); /* SP WARNING: - using substitute character */
                TY_(UngetChar)('&', doc->docIn);  /* otherwise put it back */
            }
        }
        else
        {
            /* put this non-entity lead char back */
            TY_(UngetChar)(c1, doc->docIn);
            /* Have leading surrogate pair, with no tail */
            TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, ch, 0); /* SP WARNING: - using substitute character */
            ch = 0xFFFD;
        }
    } 
    else if (!preserveEntities && found && TY_(IsHighSurrogate)(ch))
    {
        /* Have trailing surrogate pair, with no lead */
        TY_(ReportSurrogateError)(doc, BAD_SURROGATE_LEAD, ch, 0); /* SP WARNING: - using substitute character */
        ch = 0xFFFD;
    }

    /* deal with unrecognized or invalid entities */
    /* #433012 - fix by Randy Waki 17 Feb 01 */
    /* report invalid NCR's - Terry Teague 01 Sep 01 */
    if ( !found || (ch >= 128 && ch <= 159) || (ch >= 256 && c != ';') )
    {
        /* set error position just before offending character */
        SetLexerLocus( doc, lexer );
        lexer->columns = startcol;

        if (lexer->lexsize > start + 1)
        {
            if (ch >= 128 && ch <= 159)
            {
                /* invalid numeric character reference */
                
                uint c1 = 0;
                int replaceMode = DISCARDED_CHAR;
            
                /* Always assume Win1252 in this circumstance. */
                c1 = TY_(DecodeWin1252)( ch );

                if ( c1 )
                    replaceMode = REPLACED_CHAR;
                
                if ( c != ';' )  /* issue warning if not terminated by ';' */
                    TY_(ReportEntityError)( doc, MISSING_SEMICOLON_NCR,
                                            lexer->lexbuf+start, c );
 
                TY_(ReportEncodingError)(doc, INVALID_NCR, ch, replaceMode == DISCARDED_CHAR);
                
                if ( c1 )
                {
                    /* make the replacement */
                    lexer->lexsize = start;
                    TY_(AddCharToLexer)( lexer, c1 );
                    semicolon = no;
                }
                else
                {
                    /* discard */
                    lexer->lexsize = start;
                    semicolon = no;
               }
               
            }
            else
                TY_(ReportEntityError)( doc, UNKNOWN_ENTITY,
                                        lexer->lexbuf+start, ch );

            if (semicolon)
                TY_(AddCharToLexer)( lexer, ';' );
        }
        else
        {
            /*\ 
             *  Issue #207 - A naked & is allowed in HTML5, as an unambiguous ampersand!
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(ReportEntityError)( doc, UNESCAPED_AMPERSAND,
                                    lexer->lexbuf+start, ch );
            }
        }
    }
    else
    {
        if ( c != ';' )    /* issue warning if not terminated by ';' */
        {
            /* set error position just before offending chararcter */
            SetLexerLocus( doc, lexer );
            lexer->columns = startcol;
            TY_(ReportEntityError)( doc, MISSING_SEMICOLON, lexer->lexbuf+start, c );
        }

        if (preserveEntities)
            TY_(AddCharToLexer)( lexer, ';' );
        else
        {
            lexer->lexsize = start;
            if ( ch == 160 && (mode == Preformatted) )
                ch = ' ';
            TY_(AddCharToLexer)( lexer, ch );

            if ( ch == '&' && !cfgBool(doc, TidyQuoteAmpersand) )
                AddStringToLexer( lexer, "amp;" );
        }

        /* Detect extended vs. basic entities */
        TY_(ConstrainVersion)( doc, entver );
    }
}